

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maplayers.cpp
# Opt level: O1

void __thiscall CMapLayers::PlaceEasterEggs(CMapLayers *this,CLayers *pLayers)

{
  int iVar1;
  CMapItemLayerTilemap *pCVar2;
  int iVar3;
  CTile *pCVar4;
  undefined4 extraout_var;
  uint size;
  
  pCVar2 = pLayers->m_pGameLayer;
  if (this->m_pEggTiles != (CTile *)0x0) {
    mem_free(this->m_pEggTiles);
  }
  iVar3 = pCVar2->m_Width;
  this->m_EggLayerWidth = iVar3;
  iVar1 = pCVar2->m_Height;
  this->m_EggLayerHeight = iVar1;
  size = iVar3 * iVar1 * 4;
  pCVar4 = (CTile *)mem_alloc(size);
  this->m_pEggTiles = pCVar4;
  mem_zero(pCVar4,size);
  iVar3 = (*(pLayers->m_pMap->super_IInterface)._vptr_IInterface[2])
                    (pLayers->m_pMap,(ulong)(uint)pCVar2->m_Data);
  pCVar4 = (CTile *)CONCAT44(extraout_var,iVar3);
  PlaceEggDoodads(this->m_EggLayerWidth,this->m_EggLayerHeight,this->m_pEggTiles,pCVar4,3,2,
                  PlaceEasterEggs::s_aBasketIDs,2,0xfa);
  PlaceEggDoodads(this->m_EggLayerWidth,this->m_EggLayerHeight,this->m_pEggTiles,pCVar4,2,1,
                  PlaceEasterEggs::s_aDoubleEggIDs,6,100);
  PlaceEggDoodads(this->m_EggLayerWidth,this->m_EggLayerHeight,this->m_pEggTiles,pCVar4,1,1,
                  PlaceEasterEggs::s_aEggIDs,0x14,0x1e);
  return;
}

Assistant:

void CMapLayers::PlaceEasterEggs(const CLayers *pLayers)
{
	CMapItemLayerTilemap *pGameLayer = pLayers->GameLayer();
	if(m_pEggTiles)
		mem_free(m_pEggTiles);

	m_EggLayerWidth = pGameLayer->m_Width;
	m_EggLayerHeight = pGameLayer->m_Height;
	int DataSize = sizeof(CTile) * m_EggLayerWidth * m_EggLayerHeight;
	m_pEggTiles = (CTile *)mem_alloc(DataSize);
	mem_zero(m_pEggTiles, DataSize);
	CTile *pGameLayerTiles = (CTile *)pLayers->Map()->GetData(pGameLayer->m_Data);

	// first pass: baskets
	static const int s_aBasketIDs[] = {
		38,
		86
	};

	static const int s_BasketCount = sizeof(s_aBasketIDs)/sizeof(s_aBasketIDs[0]);
	PlaceEggDoodads(m_EggLayerWidth, m_EggLayerHeight, m_pEggTiles, pGameLayerTiles, 3, 2, s_aBasketIDs, s_BasketCount, 250);

	// second pass: double eggs
	static const int s_aDoubleEggIDs[] = {
		9,
		25,
		41,
		57,
		73,
		89
	};

	static const int s_DoubleEggCount = sizeof(s_aDoubleEggIDs)/sizeof(s_aDoubleEggIDs[0]);
	PlaceEggDoodads(m_EggLayerWidth, m_EggLayerHeight, m_pEggTiles, pGameLayerTiles, 2, 1, s_aDoubleEggIDs, s_DoubleEggCount, 100);

	// third pass: eggs
	static const int s_aEggIDs[] = {
		1, 2, 3, 4, 5,
		17, 18, 19, 20,
		33, 34, 35, 36,
		49, 50,     52,
		65, 66,
			82,
			98
	};

	static const int s_EggCount = sizeof(s_aEggIDs)/sizeof(s_aEggIDs[0]);
	PlaceEggDoodads(m_EggLayerWidth, m_EggLayerHeight, m_pEggTiles, pGameLayerTiles, 1, 1, s_aEggIDs, s_EggCount, 30);
}